

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O1

void completeHessianDiagonal(HighsOptions *options,HighsHessian *hessian)

{
  long lVar1;
  uint uVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pdVar5;
  uint uVar6;
  HighsInt HVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  bool bVar18;
  
  uVar2 = hessian->dim_;
  uVar9 = (ulong)(int)uVar2;
  uVar6 = HighsHessian::numNz(hessian);
  if ((long)uVar9 < 1) {
    uVar16 = 0;
  }
  else {
    uVar12 = 0;
    uVar16 = 0;
    do {
      iVar8 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[uVar12];
      uVar13 = 1;
      if (iVar8 < (int)uVar6) {
        uVar13 = (uint)(uVar12 !=
                       (uint)(hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                             .super__Vector_impl_data._M_start[iVar8]);
      }
      uVar16 = uVar16 + uVar13;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  highsLogDev(&(options->super_HighsOptionsStruct).log_options,kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros onto the diagonal\n",
              (ulong)uVar2,(ulong)uVar6,(ulong)uVar16);
  if (uVar16 != 0) {
    HVar7 = HighsHessian::numNz(hessian);
    iVar10 = HVar7 + uVar16;
    std::vector<int,_std::allocator<int>_>::resize(&hessian->index_,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(&hessian->value_,(long)iVar10);
    iVar8 = HighsHessian::numNz(hessian);
    piVar3 = (hessian->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar3[uVar9] = iVar10;
    if (0 < (int)uVar2) {
      piVar4 = (hessian->index_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar5 = (hessian->value_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        uVar12 = uVar9 - 1;
        iVar15 = piVar3[uVar9 - 1];
        if (iVar15 < iVar8 + -1) {
          lVar14 = (long)iVar8;
          lVar17 = 0;
          do {
            piVar4[(long)iVar10 + lVar17 + -1] = piVar4[lVar14 + lVar17 + -1];
            pdVar5[(long)iVar10 + lVar17 + -1] = pdVar5[lVar14 + lVar17 + -1];
            iVar15 = piVar3[uVar12];
            lVar1 = lVar14 + lVar17;
            lVar17 = lVar17 + -1;
          } while ((long)iVar15 < lVar1 + -2);
          iVar10 = iVar10 + (int)lVar17;
        }
        bVar18 = true;
        iVar11 = iVar10;
        if (iVar15 < iVar8) {
          iVar11 = iVar10 + -1;
          piVar4[(long)iVar10 + -1] = piVar4[iVar15];
          pdVar5[(long)iVar10 + -1] = pdVar5[iVar15];
          bVar18 = uVar12 != (uint)piVar4[iVar15];
        }
        iVar10 = iVar11;
        if (bVar18) {
          iVar10 = iVar11 + -1;
          piVar4[(long)iVar11 + -1] = (int)uVar12;
          pdVar5[(long)iVar11 + -1] = 0.0;
        }
        iVar8 = piVar3[uVar12];
        piVar3[uVar12] = iVar10;
        bVar18 = 1 < (long)uVar9;
        uVar9 = uVar12;
      } while (bVar18);
    }
  }
  return;
}

Assistant:

void completeHessianDiagonal(const HighsOptions& options,
                             HighsHessian& hessian) {
  // Count the number of missing diagonal entries
  HighsInt num_missing_diagonal_entries = 0;
  const HighsInt dim = hessian.dim_;
  const HighsInt num_nz = hessian.numNz();
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    HighsInt iEl = hessian.start_[iCol];
    if (iEl < num_nz) {
      if (hessian.index_[iEl] != iCol) num_missing_diagonal_entries++;
    } else {
      num_missing_diagonal_entries++;
    }
  }
  highsLogDev(options.log_options, HighsLogType::kInfo,
              "Hessian has dimension %d and %d nonzeros: inserting %d zeros "
              "onto the diagonal\n",
              (int)dim, (int)num_nz, (int)num_missing_diagonal_entries);
  assert(num_missing_diagonal_entries >= dim - num_nz);
  if (!num_missing_diagonal_entries) return;
  // There are missing diagonal entries to be inserted as explicit zeros
  const HighsInt new_num_nz = hessian.numNz() + num_missing_diagonal_entries;
  HighsInt to_iEl = new_num_nz;
  hessian.index_.resize(new_num_nz);
  hessian.value_.resize(new_num_nz);
  HighsInt next_start = hessian.numNz();
  hessian.start_[dim] = to_iEl;
  HighsInt num_missing_diagonal_entries_added = 0;
  for (HighsInt iCol = dim - 1; iCol >= 0; iCol--) {
    // Shift the entries that are sure to be off-diagonal
    for (HighsInt iEl = next_start - 1; iEl > hessian.start_[iCol]; iEl--) {
      assert(hessian.index_[iEl] != iCol);
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
    }
    // Now consider any first entry. If there is none, or if it's not
    // the diagonal, then there is no diagonal entry for this column
    bool no_diagonal_entry;
    if (hessian.start_[iCol] < next_start) {
      const HighsInt iEl = hessian.start_[iCol];
      // Copy the first entry
      to_iEl--;
      hessian.index_[to_iEl] = hessian.index_[iEl];
      hessian.value_[to_iEl] = hessian.value_[iEl];
      // If the first entry isn't the diagonal, then there is no
      // diagonal entry for this column
      no_diagonal_entry = hessian.index_[iEl] != iCol;
    } else {
      no_diagonal_entry = true;
    }
    if (no_diagonal_entry) {
      // There is no diagonal entry, so have insert an explicit zero
      to_iEl--;
      hessian.index_[to_iEl] = iCol;
      hessian.value_[to_iEl] = 0;
      num_missing_diagonal_entries_added++;
      assert(num_missing_diagonal_entries_added <=
             num_missing_diagonal_entries);
    }
    next_start = hessian.start_[iCol];
    hessian.start_[iCol] = to_iEl;
  }
  assert(to_iEl == 0);
}